

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::InlinePass::CloneSameBlockOps
          (InlinePass *this,
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          *inst,unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                *postCallSB,
          unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
          *preCallSB,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *block_ptr)

{
  Instruction *pIVar1;
  pointer pOVar2;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var3;
  bool bVar4;
  char cVar5;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var6;
  pointer pOVar7;
  long *local_68;
  undefined8 local_60;
  code *local_58;
  code *local_50;
  undefined8 local_48;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *local_40;
  unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  *local_38;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *local_30;
  
  pIVar1 = (inst->_M_t).
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_60 = 0;
  local_40 = block_ptr;
  local_38 = preCallSB;
  local_30 = postCallSB;
  local_68 = (long *)operator_new(0x20);
  *local_68 = (long)&local_30;
  local_68[1] = (long)&local_38;
  local_68[2] = (long)&local_40;
  local_68[3] = (long)this;
  local_50 = std::
             _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/inline_pass.cpp:244:33)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/inline_pass.cpp:244:33)>
             ::_M_manager;
  pOVar7 = *(pointer *)
            &(pIVar1->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl;
  pOVar2 = *(pointer *)
            ((long)&(pIVar1->operands_).
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
            + 8);
  if (pOVar7 == pOVar2) {
    bVar4 = true;
  }
  else {
    do {
      bVar4 = spvIsInIdType(pOVar7->type);
      if (bVar4) {
        _Var3._M_head_impl =
             *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
              &(pOVar7->words).large_data_._M_t.
               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ;
        _Var6._M_head_impl =
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&(pOVar7->words).small_data_;
        if ((tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )_Var3._M_head_impl !=
            (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)0x0)
        {
          _Var6._M_head_impl = _Var3._M_head_impl;
        }
        local_48 = *(undefined8 *)_Var6._M_head_impl;
        if (local_58 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        cVar5 = (*local_50)(&local_68,&local_48);
        if (cVar5 == '\0') {
          bVar4 = false;
          goto LAB_00581865;
        }
      }
      pOVar7 = pOVar7 + 1;
    } while (pOVar7 != pOVar2);
    bVar4 = true;
LAB_00581865:
    if (local_58 == (code *)0x0) {
      return bVar4;
    }
  }
  (*local_58)(&local_68,&local_68,3);
  return bVar4;
}

Assistant:

bool InlinePass::CloneSameBlockOps(
    std::unique_ptr<Instruction>* inst,
    std::unordered_map<uint32_t, uint32_t>* postCallSB,
    std::unordered_map<uint32_t, Instruction*>* preCallSB,
    std::unique_ptr<BasicBlock>* block_ptr) {
  return (*inst)->WhileEachInId([&postCallSB, &preCallSB, &block_ptr,
                                 this](uint32_t* iid) {
    const auto mapItr = (*postCallSB).find(*iid);
    if (mapItr == (*postCallSB).end()) {
      const auto mapItr2 = (*preCallSB).find(*iid);
      if (mapItr2 != (*preCallSB).end()) {
        // Clone pre-call same-block ops, map result id.
        const Instruction* inInst = mapItr2->second;
        std::unique_ptr<Instruction> sb_inst(inInst->Clone(context()));
        if (!CloneSameBlockOps(&sb_inst, postCallSB, preCallSB, block_ptr)) {
          return false;
        }

        const uint32_t rid = sb_inst->result_id();
        const uint32_t nid = context()->TakeNextId();
        if (nid == 0) {
          return false;
        }
        get_decoration_mgr()->CloneDecorations(rid, nid);
        sb_inst->SetResultId(nid);
        (*postCallSB)[rid] = nid;
        *iid = nid;
        (*block_ptr)->AddInstruction(std::move(sb_inst));
      }
    } else {
      // Reset same-block op operand.
      *iid = mapItr->second;
    }
    return true;
  });
}